

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesBody(google::
protobuf::io::Printer*)::LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__
          (void *this,FieldDescriptor *field)

{
  long lVar1;
  Printer *pPVar2;
  initializer_list<google::protobuf::io::Printer::Sub> v;
  bool bVar3;
  OneofDescriptor *pOVar4;
  char *pcVar5;
  reference pvVar6;
  int __c;
  Sub *local_180;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  undefined1 local_135;
  allocator<char> local_121;
  string local_120;
  Sub *local_100;
  Sub local_f8;
  iterator local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_30;
  undefined1 local_20 [8];
  int new_index;
  int has_bit_index;
  FieldDescriptor *field_local;
  LazySerializerEmitter *this_local;
  
  _new_index = field;
  field_local = (FieldDescriptor *)this;
  bVar3 = FieldDescriptor::has_presence(field);
  if ((!bVar3) ||
     (field = (FieldDescriptor *)_new_index,
     bVar3 = MustFlush(google::protobuf::FieldDescriptor_const__(this,(FieldDescriptor *)_new_index)
     , bVar3)) {
    GenerateSerializeWithCachedSizesBody::LazySerializerEmitter::Flush
              ((LazySerializerEmitter *)this);
  }
  pOVar4 = FieldDescriptor::real_containing_oneof((FieldDescriptor *)_new_index);
  if (pOVar4 == (OneofDescriptor *)0x0) {
    bVar3 = protobuf::internal::cpp::HasHasbit((FieldDescriptor *)_new_index);
    if ((bVar3) && (bVar3 = FieldDescriptor::has_presence((FieldDescriptor *)_new_index), bVar3)) {
      lVar1 = *this;
      pcVar5 = FieldDescriptor::index((FieldDescriptor *)_new_index,(char *)field,__c);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(lVar1 + 0x120),(long)(int)pcVar5);
      local_20._4_4_ = *pvVar6;
      if (*(int *)((long)this + 0x28) != (int)local_20._4_4_ / 0x20) {
        local_20._0_4_ = local_20._4_4_;
        if ((int)local_20._4_4_ < 0) {
          local_20._0_4_ = local_20._4_4_ + 0x1f;
        }
        local_20._0_4_ = (int)local_20._0_4_ >> 5;
        pPVar2 = *(Printer **)((long)this + 8);
        local_135 = 1;
        local_100 = &local_f8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"index",&local_121);
        protobuf::io::Printer::Sub::Sub<int&>(&local_f8,&local_120,(int *)local_20);
        local_135 = 0;
        local_40 = &local_f8;
        local_38 = 1;
        v._M_len = 1;
        v._M_array = local_40;
        absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
        Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                  ((Span<google::protobuf::io::Printer::Sub_const> *)local_30._M_local_buf,v);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_148,
                   "\n                       cached_has_bits = this_._impl_._has_bits_[$index$];\n                     "
                  );
        protobuf::io::Printer::SourceLocation::current();
        protobuf::io::Printer::Emit
                  (pPVar2,local_30._M_allocated_capacity,local_30._8_8_,local_148._M_len,
                   local_148._M_str);
        local_180 = (Sub *)&local_40;
        do {
          local_180 = local_180 + -1;
          protobuf::io::Printer::Sub::~Sub(local_180);
        } while (local_180 != &local_f8);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator(&local_121);
        *(undefined4 *)((long)this + 0x28) = local_20._0_4_;
      }
    }
    GenerateSerializeOneField
              (*this,*(Printer **)((long)this + 8),(FieldDescriptor *)_new_index,
               *(int *)((long)this + 0x28));
  }
  else {
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)((long)this + 0x10),(value_type *)&new_index);
  }
  return;
}

Assistant:

void Emit(const FieldDescriptor* field) {
      if (!field->has_presence() || MustFlush(field)) {
        Flush();
      }
      if (field->real_containing_oneof()) {
        v_.push_back(field);
      } else {
        // TODO: Defer non-oneof fields similarly to oneof fields.
        if (HasHasbit(field) && field->has_presence()) {
          // We speculatively load the entire _has_bits_[index] contents, even
          // if it is for only one field.  Deferring non-oneof emitting would
          // allow us to determine whether this is going to be useful.
          int has_bit_index = mg_->has_bit_indices_[field->index()];
          if (cached_has_bit_index_ != has_bit_index / 32) {
            // Reload.
            int new_index = has_bit_index / 32;
            p_->Emit({{"index", new_index}},
                     R"cc(
                       cached_has_bits = this_._impl_._has_bits_[$index$];
                     )cc");
            cached_has_bit_index_ = new_index;
          }
        }

        mg_->GenerateSerializeOneField(p_, field, cached_has_bit_index_);
      }
    }